

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

int expbuf_write(expbuf_t *buf,int fd)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  size_t *psVar4;
  int iVar5;
  size_t bufsz;
  iovec local_58;
  char *local_48;
  size_t local_40;
  
  local_48 = buf->start;
  bufsz = (long)buf->end - (long)local_48;
  local_58.iov_base = &bufsz;
  local_58.iov_len = 8;
  iVar5 = 0;
  local_40 = bufsz;
  do {
    if (iVar5 == 2) {
      return 0;
    }
    while (uVar2 = writev(fd,&local_58 + iVar5,2 - iVar5), uVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        return -1;
      }
    }
    if (uVar2 == 0) {
      __assert_fail("r != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/neverbleed/neverbleed.c"
                    ,0xfc,"int expbuf_write(struct expbuf_t *, int)");
    }
    psVar4 = &(&local_58)[iVar5].iov_len;
    while (uVar2 != 0) {
      uVar1 = *psVar4;
      if (uVar2 < uVar1) {
        ((iovec *)(psVar4 + -1))->iov_base =
             (void *)((long)((iovec *)(psVar4 + -1))->iov_base + uVar2);
        *psVar4 = uVar1 - uVar2;
        break;
      }
      iVar5 = iVar5 + 1;
      psVar4 = psVar4 + 2;
      uVar2 = uVar2 - uVar1;
    }
  } while( true );
}

Assistant:

static int expbuf_write(struct expbuf_t *buf, int fd)
{
    struct iovec vecs[2] = {{NULL}};
    size_t bufsz = expbuf_size(buf);
    int vecindex;
    ssize_t r;

    vecs[0].iov_base = &bufsz;
    vecs[0].iov_len = sizeof(bufsz);
    vecs[1].iov_base = buf->start;
    vecs[1].iov_len = bufsz;

    for (vecindex = 0; vecindex != sizeof(vecs) / sizeof(vecs[0]);) {
        while ((r = writev(fd, vecs + vecindex, sizeof(vecs) / sizeof(vecs[0]) - vecindex)) == -1 && errno == EINTR)
            ;
        if (r == -1)
            return -1;
        assert(r != 0);
        while (r != 0 && r >= vecs[vecindex].iov_len) {
            r -= vecs[vecindex].iov_len;
            ++vecindex;
        }
        if (r != 0) {
            vecs[vecindex].iov_base = (char *)vecs[vecindex].iov_base + r;
            vecs[vecindex].iov_len -= r;
        }
    }

    return 0;
}